

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listbox_widget.cpp
# Opt level: O2

bool listbox_vscrollbar_proc(Am_Object *self)

{
  int iVar1;
  int iVar2;
  Am_Value *pAVar3;
  
  pAVar3 = Am_Object::Get(self,399,0);
  iVar1 = Am_Value::operator_cast_to_int(pAVar3);
  pAVar3 = Am_Object::Get(self,0x67,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar3);
  return iVar2 < iVar1;
}

Assistant:

Am_Define_Formula(bool, listbox_vscrollbar)
{
  // do we need a vertical scrollbar?
  if (static_cast<int>(self.Get(Am_INNER_HEIGHT)) >
      static_cast<int>(self.Get(Am_HEIGHT))) {
    // yep, just enable it
    return (true);
  } else {
    // no, disable it
    return (false);
  }
}